

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::SliderCalcRatioFromValueT<unsigned_long_long,double>
                (ImGuiDataType data_type,unsigned_long_long v,unsigned_long_long v_min,
                unsigned_long_long v_max,float power,float linear_zero_pos)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  unsigned_long_long uVar5;
  ulong uVar6;
  unsigned_long_long uVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float local_7c;
  float local_64;
  float local_5c;
  ulong local_58;
  bool local_4a;
  float f_1;
  float f;
  unsigned_long_long v_clamped;
  bool is_power;
  float linear_zero_pos_local;
  float power_local;
  unsigned_long_long v_max_local;
  unsigned_long_long v_min_local;
  unsigned_long_long v_local;
  ImGuiDataType data_type_local;
  
  if (v_min == v_max) {
    v_local._4_4_ = 0.0;
  }
  else {
    local_4a = false;
    if ((power != 1.0) || (NAN(power))) {
      local_4a = data_type == 8 || data_type == 9;
    }
    if (v_min < v_max) {
      local_58 = ImClamp<unsigned_long_long>(v,v_min,v_max);
    }
    else {
      local_58 = ImClamp<unsigned_long_long>(v,v_max,v_min);
    }
    if (local_4a) {
      local_5c = (float)local_58;
      if (0.0 <= local_5c) {
        uVar5 = ImMax<unsigned_long_long>(0,v_min);
        uVar7 = ImMax<unsigned_long_long>(0,v_min);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = v_max - uVar7;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_58 - uVar5;
        uVar6 = SUB168(auVar4 / auVar2,0);
        fVar10 = (float)((ulong)(SUB164(auVar4 / auVar2,0) & 1) | uVar6 >> 1);
        local_7c = fVar10 + fVar10;
        if (-1 < (long)uVar6) {
          local_7c = (float)(long)uVar6;
        }
        fVar10 = ImPow(local_7c,1.0 / power);
        v_local._4_4_ = fVar10 * (1.0 - linear_zero_pos) + linear_zero_pos;
      }
      else {
        uVar5 = ImMin<unsigned_long_long>(0,v_max);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar5 - v_min;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_58 - v_min;
        uVar6 = SUB168(auVar3 / auVar1,0);
        fVar10 = (float)((ulong)(SUB164(auVar3 / auVar1,0) & 1) | uVar6 >> 1);
        local_64 = fVar10 + fVar10;
        if (-1 < (long)uVar6) {
          local_64 = (float)(long)uVar6;
        }
        fVar10 = ImPow(1.0 - local_64,1.0 / power);
        v_local._4_4_ = (1.0 - fVar10) * linear_zero_pos;
      }
    }
    else {
      lVar8 = local_58 - v_min;
      auVar11._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar11._0_8_ = lVar8;
      auVar11._12_4_ = 0x45300000;
      lVar9 = v_max - v_min;
      auVar12._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar12._0_8_ = lVar9;
      auVar12._12_4_ = 0x45300000;
      v_local._4_4_ =
           (float)(((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
                  ((auVar12._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)));
    }
  }
  return v_local._4_4_;
}

Assistant:

float ImGui::SliderCalcRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f/power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f/power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}